

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clara.hpp
# Opt level: O0

string * __thiscall
clara::TextFlow::Columns::iterator::operator*[abi_cxx11_
          (string *__return_storage_ptr__,iterator *this)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  size_t __n;
  const_reference pvVar4;
  ulong uVar5;
  long lVar6;
  allocator<char> local_119;
  string local_118 [39];
  allocator<char> local_f1;
  string local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  string col;
  size_t width;
  size_t i;
  string padding;
  iterator *this_local;
  string *row;
  
  padding.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)&i);
  width = 0;
  while( true ) {
    sVar2 = std::vector<clara::TextFlow::Column,_std::allocator<clara::TextFlow::Column>_>::size
                      (this->m_columns);
    if (sVar2 <= width) break;
    pvVar3 = std::vector<clara::TextFlow::Column,_std::allocator<clara::TextFlow::Column>_>::
             operator[](this->m_columns,width);
    __n = Column::width(pvVar3);
    pvVar4 = std::
             vector<clara::TextFlow::Column::iterator,_std::allocator<clara::TextFlow::Column::iterator>_>
             ::operator[](&this->m_iterators,width);
    pvVar3 = std::vector<clara::TextFlow::Column,_std::allocator<clara::TextFlow::Column>_>::
             operator[](this->m_columns,width);
    Column::end((iterator *)((long)&col.field_2 + 8),pvVar3);
    bVar1 = Column::iterator::operator!=(pvVar4,(iterator *)((long)&col.field_2 + 8));
    if (bVar1) {
      pvVar4 = std::
               vector<clara::TextFlow::Column::iterator,_std::allocator<clara::TextFlow::Column::iterator>_>
               ::operator[](&this->m_iterators,width);
      Column::iterator::operator*[abi_cxx11_((string *)local_b0,pvVar4);
      std::operator+(&local_d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      uVar5 = std::__cxx11::string::size();
      if (uVar5 < __n) {
        lVar6 = std::__cxx11::string::size();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_f0,__n - lVar6,' ',&local_f1);
        std::__cxx11::string::operator=((string *)&i,local_f0);
        std::__cxx11::string::~string(local_f0);
        std::allocator<char>::~allocator(&local_f1);
      }
      else {
        std::__cxx11::string::operator=((string *)&i,"");
      }
      std::__cxx11::string::~string((string *)local_b0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_118,__n,' ',&local_119);
      std::__cxx11::string::operator+=((string *)&i,local_118);
      std::__cxx11::string::~string(local_118);
      std::allocator<char>::~allocator(&local_119);
    }
    width = width + 1;
  }
  padding.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)&i);
  if ((padding.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

auto operator *() const -> std::string {
                std::string row, padding;

                for( size_t i = 0; i < m_columns.size(); ++i ) {
                    auto width = m_columns[i].width();
                    if( m_iterators[i] != m_columns[i].end() ) {
                        std::string col = *m_iterators[i];
                        row += padding + col;
                        if( col.size() < width )
                            padding = std::string( width - col.size(), ' ' );
                        else
                            padding = "";
                    }
                    else {
                        padding += std::string( width, ' ' );
                    }
                }
                return row;
            }